

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)> *__cur;
  void *__dest;
  undefined8 *puVar1;
  void *__dest_00;
  undefined8 *puVar2;
  element_type *extraout_RAX;
  undefined8 *in_RSI;
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>
  PVar3;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined4 uStack_d0;
  undefined4 local_cc;
  undefined4 uStack_c8;
  undefined8 uStack_c4;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined4 uStack_a0;
  undefined4 local_9c;
  undefined4 uStack_98;
  undefined8 uStack_94;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined4 uStack_40;
  undefined4 local_3c;
  undefined4 uStack_38;
  undefined8 uStack_34;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  
  local_e8 = *in_RSI;
  uStack_e0 = in_RSI[1];
  uStack_d8 = in_RSI[2];
  uStack_c4 = *(undefined8 *)((long)in_RSI + 0x24);
  uStack_c8 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x1c) >> 0x20);
  uStack_d0 = (undefined4)in_RSI[3];
  local_cc = (undefined4)((ulong)in_RSI[3] >> 0x20);
  local_b8 = in_RSI[6];
  uStack_b0 = in_RSI[7];
  uStack_a8 = in_RSI[8];
  uStack_94 = *(undefined8 *)((long)in_RSI + 0x54);
  uStack_98 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x4c) >> 0x20);
  uStack_a0 = (undefined4)in_RSI[9];
  local_9c = (undefined4)((ulong)in_RSI[9] >> 0x20);
  local_88 = in_RSI[0xc];
  uStack_80 = in_RSI[0xd];
  local_78 = in_RSI[0xe];
  uStack_64 = *(undefined8 *)((long)in_RSI + 0x84);
  uStack_70 = (undefined4)in_RSI[0xf];
  uStack_6c = (undefined4)*(undefined8 *)((long)in_RSI + 0x7c);
  uStack_68 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x7c) >> 0x20);
  local_58 = in_RSI[0x12];
  uStack_50 = in_RSI[0x13];
  uStack_48 = in_RSI[0x14];
  uStack_34 = *(undefined8 *)((long)in_RSI + 0xb4);
  uStack_38 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0xac) >> 0x20);
  uStack_40 = (undefined4)in_RSI[0x15];
  local_3c = (undefined4)((ulong)in_RSI[0x15] >> 0x20);
  __dest = operator_new(0xc0);
  memcpy(__dest,&local_e8,0xc0);
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = &PTR__ValuesInIteratorRangeGenerator_01076408;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  __dest_00 = operator_new(0xc0);
  puVar1[1] = __dest_00;
  puVar1[3] = (long)__dest_00 + 0xc0;
  memcpy(__dest_00,__dest,0xc0);
  puVar1[2] = (long)__dest_00 + 0xc0;
  *(undefined8 **)this = puVar1;
  *(undefined8 *)(this + 8) = 0;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_base_010764d0;
  puVar2[2] = puVar1;
  *(undefined8 **)(this + 8) = puVar2;
  operator_delete(__dest);
  PVar3.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar3.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = extraout_RAX;
  return (ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>
          )PVar3.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }